

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::EntityMarking::SetEntityMarkingString
          (EntityMarking *this,KINT8 *EMS,KUINT16 StringSize)

{
  KException *this_00;
  KString local_40;
  
  if (StringSize < 0xc) {
    memcpy(this->m_sEntityMarkingString,EMS,(ulong)StringSize);
    this->m_sEntityMarkingString[StringSize] = '\0';
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SetEntityMarkingString","");
  KException::KException(this_00,&local_40,3);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EntityMarking::SetEntityMarkingString(const KINT8 *EMS, KUINT16 StringSize) noexcept(false)
{
    if( StringSize > 11 ) throw KException( __FUNCTION__, STRING_PDU_SIZE_TOO_BIG );

    memcpy( m_sEntityMarkingString, EMS, StringSize );
    m_sEntityMarkingString[StringSize] = 0x0; // Null terminate the string.
}